

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  uint uVar1;
  uint h;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  __pid_t _Var6;
  int iVar7;
  int *piVar8;
  uint in_ECX;
  void *in_RDX;
  undefined1 *in_RSI;
  uint *in_R8;
  long in_FS_OFFSET;
  int rc2;
  UnixUnusedFd *pReadonly;
  UnixUnusedFd *pUnused;
  char *zName;
  int isNewJrnl;
  int isReadWrite;
  int isReadonly;
  int isCreate;
  int isDelete;
  int isExclusive;
  int ctrlFlags;
  int rc;
  int noLock;
  int eType;
  int openFlags;
  int fd;
  unixFile *p;
  gid_t gid;
  uid_t uid;
  mode_t openMode;
  char zTmpname [514];
  undefined4 in_stack_fffffffffffffd48;
  gid_t in_stack_fffffffffffffd4c;
  uid_t in_stack_fffffffffffffd50;
  pid_t f;
  undefined2 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5a;
  undefined1 uVar9;
  int in_stack_fffffffffffffd5c;
  UnixUnusedFd *in_stack_fffffffffffffd60;
  UnixUnusedFd *in_stack_fffffffffffffd68;
  uint uVar10;
  int local_25c;
  uint local_244;
  int local_228;
  undefined1 local_218 [528];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_25c = -1;
  uVar1 = in_ECX & 0xfff00;
  local_228 = 0;
  uVar10 = 0;
  h = in_ECX & 0x10;
  uVar2 = in_ECX & 4;
  uVar3 = in_ECX & 1;
  uVar4 = in_ECX & 2;
  uVar9 = false;
  if (((uVar2 != 0) &&
      (in_stack_fffffffffffffd5a = true, uVar9 = in_stack_fffffffffffffd5a, uVar1 != 0x4000)) &&
     (in_stack_fffffffffffffd5a = true, uVar9 = in_stack_fffffffffffffd5a, uVar1 != 0x800)) {
    in_stack_fffffffffffffd5a = uVar1 == 0x80000;
    uVar9 = in_stack_fffffffffffffd5a;
  }
  uVar5 = (uint)(byte)uVar9;
  memset(local_218,0xaa,0x202);
  f = randomnessPid;
  _Var6 = getpid();
  if (f != _Var6) {
    randomnessPid = getpid();
    sqlite3_randomness((int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                       (void *)CONCAT44(in_stack_fffffffffffffd5c,
                                        CONCAT13(uVar9,CONCAT12(in_stack_fffffffffffffd5a,
                                                                in_stack_fffffffffffffd58))));
  }
  memset(in_RDX,0,0x78);
  if (uVar1 == 0x100) {
    in_stack_fffffffffffffd68 =
         findReusableFd((char *)CONCAT44(uVar4,uVar5),(int)((ulong)in_RSI >> 0x20));
    if (in_stack_fffffffffffffd68 == (UnixUnusedFd *)0x0) {
      in_stack_fffffffffffffd68 =
           (UnixUnusedFd *)
           sqlite3_malloc64(CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      if (in_stack_fffffffffffffd68 == (UnixUnusedFd *)0x0) {
        local_228 = 7;
        goto LAB_0013924f;
      }
    }
    else {
      local_25c = in_stack_fffffffffffffd68->fd;
    }
    *(UnixUnusedFd **)((long)in_RDX + 0x30) = in_stack_fffffffffffffd68;
  }
  else if (in_RSI == (undefined1 *)0x0) {
    local_228 = unixGetTempname((int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                                (char *)CONCAT44(in_stack_fffffffffffffd5c,
                                                 CONCAT13(uVar9,CONCAT12(in_stack_fffffffffffffd5a,
                                                                         in_stack_fffffffffffffd58))
                                                ));
    if (local_228 != 0) goto LAB_0013924f;
    in_RSI = local_218;
    local_228 = 0;
  }
  local_244 = in_ECX;
  if (local_25c < 0) {
    local_228 = findCreateFileMode((char *)CONCAT44(uVar4,uVar5),(int)((ulong)in_RSI >> 0x20),
                                   (mode_t *)in_stack_fffffffffffffd68,
                                   (uid_t *)in_stack_fffffffffffffd60,
                                   (gid_t *)CONCAT44(in_stack_fffffffffffffd5c,
                                                     CONCAT13(uVar9,CONCAT12(
                                                  in_stack_fffffffffffffd5a,
                                                  in_stack_fffffffffffffd58))));
    if (local_228 != 0) goto LAB_0013924f;
    local_25c = robust_open((char *)CONCAT44(in_stack_fffffffffffffd5c,
                                             CONCAT13(uVar9,CONCAT12(in_stack_fffffffffffffd5a,
                                                                     in_stack_fffffffffffffd58))),f,
                            in_stack_fffffffffffffd50);
    if (local_25c < 0) {
      if (((uVar5 == 0) || (piVar8 = __errno_location(), *piVar8 != 0xd)) ||
         (iVar7 = (*aSyscall[2].pCurrent)(in_RSI,0), iVar7 == 0)) {
        piVar8 = __errno_location();
        if ((*piVar8 != 0x15) && (uVar4 != 0)) {
          local_244 = in_ECX & 0xfffffff9 | 1;
          uVar3 = 1;
          in_stack_fffffffffffffd60 =
               findReusableFd((char *)CONCAT44(uVar4,uVar5),(int)((ulong)in_RSI >> 0x20));
          if (in_stack_fffffffffffffd60 == (UnixUnusedFd *)0x0) {
            local_25c = robust_open((char *)CONCAT44(in_stack_fffffffffffffd5c,
                                                     CONCAT13(uVar9,CONCAT12(
                                                  in_stack_fffffffffffffd5a,
                                                  in_stack_fffffffffffffd58))),f,
                                    in_stack_fffffffffffffd50);
          }
          else {
            local_25c = in_stack_fffffffffffffd60->fd;
            sqlite3_free((void *)0x1390aa);
          }
        }
      }
      else {
        local_228 = 0x608;
      }
    }
    if (-1 < local_25c) {
      if ((local_244 & 0x80800) != 0) {
        robustFchown(f,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      }
      goto LAB_0013913d;
    }
    sqlite3CantopenError(0);
    iVar7 = unixLogErrorAtLine((int)((ulong)in_RSI >> 0x20),(char *)in_stack_fffffffffffffd68,
                               (char *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    if (local_228 == 0) {
      local_228 = iVar7;
    }
  }
  else {
LAB_0013913d:
    if (in_R8 != (uint *)0x0) {
      *in_R8 = local_244;
    }
    if (*(long *)((long)in_RDX + 0x30) != 0) {
      **(int **)((long)in_RDX + 0x30) = local_25c;
      *(uint *)(*(long *)((long)in_RDX + 0x30) + 4) = local_244 & 3;
    }
    if ((in_ECX & 8) != 0) {
      (*aSyscall[0x10].pCurrent)(in_RSI);
      uVar10 = uVar10 | 0x20;
    }
    if (uVar3 != 0) {
      uVar10 = uVar10 | 2;
    }
    if (uVar1 != 0x100) {
      uVar10 = uVar10 | 0x80;
    }
    if (uVar5 != 0) {
      uVar10 = uVar10 | 8;
    }
    if ((local_244 & 0x40) != 0) {
      uVar10 = uVar10 | 0x40;
    }
    local_228 = fillInUnixFile((sqlite3_vfs *)CONCAT44(local_228,uVar10),h,
                               (sqlite3_file *)CONCAT44(uVar2,uVar3),(char *)CONCAT44(uVar4,uVar5),
                               (int)((ulong)in_RSI >> 0x20));
  }
  if (local_228 != 0) {
    sqlite3_free((void *)0x139244);
  }
LAB_0013924f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_228;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0x0FFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a super- or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_SUPER_JOURNAL
     || eType==SQLITE_OPEN_MAIN_JOURNAL
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true:
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and super-journal are never
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_SUPER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_SUPER_JOURNAL
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

#ifdef SQLITE_ASSERT_NO_FILES
  /* Applications that never read or write a persistent disk files */
  assert( zName==0 );
#endif

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY|O_NOFOLLOW);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        UnixUnusedFd *pReadonly = 0;
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        pReadonly = findReusableFd(zName, flags);
        if( pReadonly ){
          fd = pReadonly->fd;
          sqlite3_free(pReadonly);
        }else{
          fd = robust_open(zName, openFlags, openMode);
        }
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* The owner of the rollback journal or WAL file should always be the
    ** same as the owner of the database file.  Try to ensure that this is
    ** the case.  The chown() system call will be a no-op if the current
    ** process lacks root privileges, be we should at least try.  Without
    ** this step, if a root process opens a database file, it can leave
    ** behinds a journal/WAL that is owned by root and hence make the
    ** database inaccessible to unprivileged processes.
    **
    ** If openMode==0, then that means uid and gid are not set correctly
    ** (probably because SQLite is configured to use 8+3 filename mode) and
    ** in that case we do not want to attempt the chown().
    */
    if( openMode && (flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL))!=0 ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags =
                          flags & (SQLITE_OPEN_READONLY|SQLITE_OPEN_READWRITE);
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile
          ** and clear all the structure's references.  Specifically,
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif

  assert( zPath==0 || zPath[0]=='/'
      || eType==SQLITE_OPEN_SUPER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}